

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void clear_memory_glyph(schar x,schar y,int to)

{
  rm *prVar1;
  int to_local;
  schar y_local;
  schar x_local;
  
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xffffffc0 | to & 0x3fU;
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xfffff83f;
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xffe007ff;
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xc01fffff;
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xbfffffff;
  prVar1 = level->locations[x] + y;
  *(uint *)prVar1 = *(uint *)prVar1 & 0x7fffffff;
  *(uint *)&level->locations[x][y].field_0x6 =
       *(uint *)&level->locations[x][y].field_0x6 & 0xfffffff7;
  *(uint *)&level->locations[x][y].field_0x6 =
       *(uint *)&level->locations[x][y].field_0x6 & 0xfffffffb;
  *(uint *)&level->locations[x][y].field_0x6 =
       *(uint *)&level->locations[x][y].field_0x6 & 0xfffffffe;
  *(uint *)&level->locations[x][y].field_0x6 =
       *(uint *)&level->locations[x][y].field_0x6 & 0xfffffffd;
  return;
}

Assistant:

void clear_memory_glyph(schar x, schar y, int to)
{
    level->locations[x][y].mem_bg = to;
    level->locations[x][y].mem_trap = 0;
    level->locations[x][y].mem_obj = 0;
    level->locations[x][y].mem_obj_mn = 0;
    level->locations[x][y].mem_obj_stacks = 0;
    level->locations[x][y].mem_obj_prize = 0;
    level->locations[x][y].mem_invis = 0;
    level->locations[x][y].mem_stepped = 0;
    level->locations[x][y].mem_door_l = 0;
    level->locations[x][y].mem_door_t = 0;
}